

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__frame_object
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  xmlChar **ppxVar1;
  ParserChar *text;
  bool bVar2;
  undefined8 *puVar3;
  StringHash SVar4;
  
  puVar3 = (undefined8 *)
           GeneratedSaxParser::StackMemoryManager::newObject
                     (&(this->
                       super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                       ).super_ParserTemplateBase.mStackMemoryManager,8);
  *puVar3 = 0;
  *attributeDataPtr = puVar3;
  ppxVar1 = attributes->attributes;
  if (ppxVar1 != (xmlChar **)0x0) {
    text = *ppxVar1;
    while (text != (ParserChar *)0x0) {
      SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
      if (SVar4 == 0x7304b) {
        *puVar3 = ppxVar1[1];
      }
      else {
        bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                           ERROR_UNKNOWN_ATTRIBUTE,0x4818814,text,ppxVar1[1]);
        if (bVar2) {
          return false;
        }
      }
      text = ppxVar1[2];
      ppxVar1 = ppxVar1 + 2;
    }
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__frame_object( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__frame_object( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

frame_object__AttributeData* attributeData = newData<frame_object__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_LINK:
    {

attributeData->link = attributeValue;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_FRAME_OBJECT, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}